

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhLoadPage(lhash_kv_engine *pEngine,pgno pnum,lhpage *pMaster,lhpage **ppOut,int iNest)

{
  ushort *puVar1;
  sxu16 sVar2;
  int iVar3;
  int iVar4;
  lhpage *pPage;
  lhcell *pCell;
  ulong uVar5;
  lhpage *pMaster_00;
  ushort uVar6;
  unqlite_page *puVar7;
  uchar *buf;
  uchar *puVar8;
  sxu32 nKey;
  sxu32 iHash;
  lhpage *local_58;
  uchar *local_50;
  pgno *local_48;
  unqlite_page *pRaw;
  sxu64 nData;
  
  iVar3 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,pnum,&pRaw);
  if (iVar3 != 0) {
    return iVar3;
  }
  pPage = (lhpage *)pRaw->pUserData;
  if (pPage == (lhpage *)0x0) {
    pPage = lhNewPage(pEngine,pRaw,pMaster);
    if (pPage == (lhpage *)0x0) {
      return -1;
    }
    puVar1 = (ushort *)pPage->pRaw->zData;
    (pPage->sHdr).iOfft = *puVar1 << 8 | *puVar1 >> 8;
    (pPage->sHdr).iFree = puVar1[1] << 8 | puVar1[1] >> 8;
    local_48 = &(pPage->sHdr).iSlave;
    SyBigEndianUnpack64((uchar *)(puVar1 + 2),local_48);
    puVar7 = pPage->pRaw;
    puVar8 = puVar7->zData;
    uVar5 = (ulong)(pPage->sHdr).iFree;
    if (uVar5 == 0) {
      sVar2 = 0;
LAB_00112be9:
      pPage->nFree = sVar2;
      uVar5 = (ulong)(pPage->sHdr).iOfft;
      local_58 = pMaster;
      if (uVar5 == 0) {
LAB_00112d1f:
        if (*local_48 != 0) {
          pMaster_00 = pPage;
          if (local_58 != (lhpage *)0x0) {
            pMaster_00 = local_58;
          }
          lhLoadPage(pEngine,*local_48,pMaster_00,(lhpage **)0x0,iNest);
        }
        goto LAB_00112b18;
      }
      buf = puVar8 + uVar5;
      local_50 = buf + pPage->pHash->iPageSize;
      iVar3 = -0x18;
      do {
        SyBigEndianUnpack32(buf,&iHash);
        SyBigEndianUnpack32(buf + 4,&nKey);
        SyBigEndianUnpack64(buf + 8,&nData);
        uVar6 = *(ushort *)(buf + 0x10) << 8 | *(ushort *)(buf + 0x10) >> 8;
        if ((uVar6 != 0) && (local_50 <= puVar8 + uVar6)) {
LAB_00112d58:
          puVar7 = pPage->pRaw;
          break;
        }
        pCell = lhNewCell(pPage->pHash,pPage);
        if (pCell == (lhcell *)0x0) {
LAB_00112d50:
          iVar3 = -1;
          goto LAB_00112d58;
        }
        pCell->iNext = uVar6;
        pCell->nKey = nKey;
        pCell->nData = nData;
        pCell->nHash = iHash;
        SyBigEndianUnpack64(buf + 0x12,&pCell->iOvfl);
        pCell->iStart = (short)buf - (short)puVar8;
        iVar4 = lhConsumeCellkey(pCell,unqliteDataConsumer,&pCell->sKey,
                                 (uint)(0x40000 < pCell->nKey));
        if (iVar4 != 0) {
          SyBlobRelease(&pCell->sKey);
        }
        iVar4 = lhInstallCell(pCell);
        if (iVar4 != 0) goto LAB_00112d50;
        if ((ulong)pCell->iNext == 0) goto LAB_00112d1f;
        puVar7 = pPage->pRaw;
        puVar8 = puVar7->zData;
        buf = puVar8 + pCell->iNext;
      } while (buf < local_50);
    }
    else {
      iVar3 = -0x18;
      sVar2 = 0;
      do {
        uVar6 = *(ushort *)(puVar8 + uVar5) << 8 | *(ushort *)(puVar8 + uVar5) >> 8;
        sVar2 = sVar2 + (*(ushort *)(puVar8 + uVar5 + 2) << 8 | *(ushort *)(puVar8 + uVar5 + 2) >> 8
                        );
        if (uVar6 == 0) goto LAB_00112be9;
        uVar5 = (ulong)uVar6;
      } while ((long)uVar5 < (long)pPage->pHash->iPageSize);
    }
    (*pEngine->pIo->xPageUnref)(puVar7);
  }
  else {
LAB_00112b18:
    iVar3 = 0;
    if (ppOut != (lhpage **)0x0) {
      *ppOut = pPage;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int lhLoadPage(lhash_kv_engine *pEngine,pgno pnum,lhpage *pMaster,lhpage **ppOut,int iNest)
{
	unqlite_page *pRaw;
	lhpage *pPage = 0; /* cc warning */
	int rc;
	/* Aquire the page from the pager first */
	rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pnum,&pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( pRaw->pUserData ){
		/* The page is already parsed and loaded in memory. Point to it */
		pPage = (lhpage *)pRaw->pUserData;
	}else{
		/* Allocate a new page */
		pPage = lhNewPage(pEngine,pRaw,pMaster);
		if( pPage == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Process the page */
		rc = lhParsePageHeader(pPage);
		if( rc == UNQLITE_OK ){
			/* Load cells */
			rc = lhLoadCells(pPage);
		}
		if( rc != UNQLITE_OK ){
			pEngine->pIo->xPageUnref(pPage->pRaw); /* pPage will be released inside this call */
			return rc;
		}
		if( pPage->sHdr.iSlave > 0 && iNest < 128 ){
			if( pMaster == 0 ){
				pMaster = pPage;
			}
			/* Slave page. Not a fatal error if something goes wrong here */
			lhLoadPage(pEngine,pPage->sHdr.iSlave,pMaster,0,iNest++);
		}
	}
	if( ppOut ){
		*ppOut = pPage;
	}
	return UNQLITE_OK;
}